

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void idx(item *x,item *y)

{
  int iVar1;
  int iVar2;
  typeDesc *ptVar3;
  char *msg;
  
  if (y->typeIndex != intTypeIndex) {
    msg = "index not an integer";
LAB_00106e9a:
    mark(msg);
    exit(-1);
  }
  ptVar3 = getType(x->typeIndex);
  iVar2 = x->alr;
  iVar1 = y->mode;
  if (iVar2 == 0) {
    if (iVar1 != 0x2c2) {
      if (iVar1 == 0x2bd) {
        iVar2 = y->a;
        if ((iVar2 < 0) || (ptVar3->len <= iVar2)) {
          msg = "index out of range";
          goto LAB_00106e9a;
        }
        x->a = x->a + iVar2 * ptVar3->base->size;
        goto LAB_00106e7f;
      }
      load(y);
    }
    put(0x1e,y->r,0,ptVar3->len);
    put(0x12,y->r,y->r,ptVar3->base->size);
    if (x->r != 0) {
      put(0,y->r,x->r,y->r);
      regs[x->r] = 0;
    }
    x->r = y->r;
    goto LAB_00106e7f;
  }
  if (iVar1 == 0x2c2) {
LAB_00106db7:
    put(0xe,y->r,0,iVar2);
    put(0x12,y->r,y->r,ptVar3->base->size);
    if (x->r != 0) {
      put(0,y->r,x->r,y->r);
      regs[x->r] = 0;
    }
    x->r = y->r;
  }
  else {
    if (iVar1 != 0x2bd) {
      load(y);
      iVar2 = x->alr;
      goto LAB_00106db7;
    }
    iVar2 = getReg();
    put(0x10,iVar2,0,y->a);
    put(0xe,iVar2,0,x->alr);
    put(0x12,iVar2,iVar2,ptVar3->base->size);
    if (x->r != 0) {
      put(0,iVar2,x->r,iVar2);
      regs[x->r] = 0;
    }
    x->r = iVar2;
  }
  regs[x->alr] = 0;
LAB_00106e7f:
  x->typeIndex = ptVar3->base->index;
  return;
}

Assistant:

procedure 
void idx(struct item *x, struct item *y) {
	variable int r;
	variable struct typeDesc *type;
	type=NULL; r = 0;
	if (y->typeIndex != intTypeIndex) {
		mark("index not an integer");
		exit(-1);
	}
	type = getType(x->typeIndex);

	 /* array is given as parameter */
	if (x->alr != 0) {
		if (y->mode == CLASS_CONST) {
			r = getReg();
			put(RISC_ADDI,r,0,y->a); 
			put(RISC_CHK,r,0,x->alr); 

			put(RISC_MULI,r,r,type->base->size);
			if (x->r != 0) { 
			
				/* R[r] := FP/global + R[r] */
				put(RISC_ADD,r,x->r,r); 
				regs[x->r] = 0;
			}
			x->r = r;
			regs[x->alr] = 0;
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			put(RISC_CHK,y->r,0,x->alr);
			put(RISC_MULI,y->r,y->r,type->base->size);
			if (x->r != 0) {
				put(RISC_ADD,y->r,x->r,y->r);
				regs[x->r] = 0;
			}
			x->r = y->r;
			regs[x->alr] = 0;
		}
	} else {
		if (y->mode == CLASS_CONST) {
			if ((y->a < 0) || (y->a >= type->len)) {
				mark("index out of range");
				exit(-1);
			}
			x->a = x->a + y->a * type->base->size; /* fix */
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			put(RISC_CHKI,y->r,0,type->len);
			put(RISC_MULI,y->r,y->r,type->base->size);
			if (x->r != 0) {
				put(RISC_ADD,y->r,x->r,y->r);
				regs[x->r] = 0;
			}
			x->r = y->r;
		}
	}
	x->typeIndex = type->base->index;
}